

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

IShaderResourceVariable * __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::GetStaticVariableByName
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,SHADER_TYPE ShaderType,Char *Name)

{
  undefined *puVar1;
  SHADER_TYPE SVar2;
  undefined8 uVar3;
  PipelineResourceSignatureImplType *this_00;
  char (*in_stack_ffffffffffffff68) [3];
  code *pcVar4;
  Char *local_80;
  undefined1 local_78 [8];
  string _msg_1;
  undefined1 local_48 [8];
  string _msg;
  Char *Name_local;
  SHADER_TYPE ShaderType_local;
  PipelineStateBase<Diligent::EngineVkImplTraits> *this_local;
  
  _msg.field_2._8_8_ = Name;
  CheckPipelineReady(this);
  if ((this->m_UsingImplicitSignature & 1U) == 0) {
    FormatString<char[173]>
              ((string *)local_48,
               (char (*) [173])
               "IPipelineState::GetStaticVariableByName is not allowed for pipelines that use explicit resource signatures. Use IPipelineResourceSignature::GetStaticVariableByName instead."
              );
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar3 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(2,uVar3,0);
    }
    std::__cxx11::string::~string((string *)local_48);
    this_local = (PipelineStateBase<Diligent::EngineVkImplTraits> *)0x0;
  }
  else {
    SVar2 = Diligent::operator&(this->m_ActiveShaderStages,ShaderType);
    if (SVar2 == SHADER_TYPE_UNKNOWN) {
      local_80 = GetShaderTypeLiteralName(ShaderType);
      FormatString<char[33],char_const*,char[19],char_const*,char[35],char_const*,char[3]>
                ((string *)local_78,(Diligent *)"Unable to find static variable \'",
                 (char (*) [33])((long)&_msg.field_2 + 8),(char **)"\' in shader stage ",
                 (char (*) [19])&local_80,(char **)" as the stage is inactive in PSO \'",
                 (char (*) [35])
                 &(this->
                  super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                  ).m_Desc,(char **)"\'.",in_stack_ffffffffffffff68);
      if (DebugMessageCallback != (undefined *)0x0) {
        pcVar4 = (code *)DebugMessageCallback;
        uVar3 = std::__cxx11::string::c_str();
        (*pcVar4)(1,uVar3,0);
      }
      std::__cxx11::string::~string((string *)local_78);
      this_local = (PipelineStateBase<Diligent::EngineVkImplTraits> *)0x0;
    }
    else {
      this_00 = GetResourceSignature(this,0);
      this_local = (PipelineStateBase<Diligent::EngineVkImplTraits> *)
                   PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::
                   GetStaticVariableByName
                             (&this_00->
                               super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                              ShaderType,(Char *)_msg.field_2._8_8_);
    }
  }
  return (IShaderResourceVariable *)this_local;
}

Assistant:

GetStaticVariableByName(SHADER_TYPE ShaderType,
                                                                                const Char* Name) override final
    {
        CheckPipelineReady();

        if (!m_UsingImplicitSignature)
        {
            LOG_ERROR_MESSAGE("IPipelineState::GetStaticVariableByName is not allowed for pipelines that use explicit "
                              "resource signatures. Use IPipelineResourceSignature::GetStaticVariableByName instead.");
            return nullptr;
        }

        if ((m_ActiveShaderStages & ShaderType) == 0)
        {
            LOG_WARNING_MESSAGE("Unable to find static variable '", Name, "' in shader stage ", GetShaderTypeLiteralName(ShaderType),
                                " as the stage is inactive in PSO '", this->m_Desc.Name, "'.");
            return nullptr;
        }

        return this->GetResourceSignature(0)->GetStaticVariableByName(ShaderType, Name);
    }